

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O0

void __thiscall
ObserverManager_SharedPtr_Test::~ObserverManager_SharedPtr_Test
          (ObserverManager_SharedPtr_Test *this)

{
  ObserverManager_SharedPtr_Test *this_local;
  
  ~ObserverManager_SharedPtr_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ObserverManager, SharedPtr)  {
    std::stringstream out;

    auto a = std::make_shared<A>(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a);

    auto b = std::make_shared<B>(out);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    ObserverManager::notify(&FooBarProtocol::foo);

    ObserverManager::unsubscribe<FooBarProtocol>(b);

    ObserverManager::notify(&FooBarProtocol::bar, "Tac");
    
    EXPECT_EQ("Tic Tac ", out.str());
}